

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr __thiscall c4::yml::Parser::_finish_filter_arena(Parser *this,substr dst,size_t pos)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  ulong len_;
  substr sVar5;
  char msg [42];
  basic_substring<char> local_a8;
  undefined7 uStack_98;
  undefined1 uStack_91;
  undefined2 uStack_90;
  undefined5 local_8e;
  undefined1 uStack_89;
  undefined2 uStack_88;
  char acStack_86 [14];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  len_ = dst.len;
  if ((this->m_filter_arena).len < pos) {
    uStack_88 = 0x6572;
    builtin_strncpy(acStack_86,"na.len)",8);
    uStack_98 = 0x6d203d3c20736f;
    uStack_91 = 0x5f;
    uStack_90 = 0x6966;
    local_8e = 0x5f7265746c;
    uStack_89 = 0x61;
    local_a8.str = (char *)0x6166206b63656863;
    local_a8.len._0_7_ = 0x28203a64656c69;
    local_a8.len._7_1_ = 0x70;
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        sVar5 = (substr)(*pcVar1)();
        return sVar5;
      }
    }
    local_50 = 0;
    uStack_48 = 0x7f81;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7f81) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7f81) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x2a,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if (len_ < pos) {
    uStack_98 = 0x64203d3c20736f;
    uStack_91 = 0x73;
    uStack_90 = 0x2e74;
    local_8e = 0x296e656c;
    local_a8.str = (char *)0x6166206b63656863;
    local_a8.len._0_7_ = 0x28203a64656c69;
    local_a8.len._7_1_ = 0x70;
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        sVar5 = (substr)(*pcVar1)();
        return sVar5;
      }
    }
    local_78 = 0;
    uStack_70 = 0x7f82;
    local_68 = 0;
    pcStack_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f82) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f82) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x1f,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  memcpy(dst.str,(this->m_filter_arena).str,pos);
  if (pos == 0xffffffffffffffff || pos <= len_) {
    if (pos != 0xffffffffffffffff) {
      len_ = pos;
    }
    basic_substring<char>::basic_substring(&local_a8,dst.str,len_);
    sVar5.len._0_7_ = (undefined7)local_a8.len;
    sVar5.str = local_a8.str;
    sVar5.len._7_1_ = local_a8.len._7_1_;
    return sVar5;
  }
  if ((s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar1 = (code *)swi(3);
      sVar5 = (substr)(*pcVar1)();
      return sVar5;
    }
  }
  handle_error(0x21a325,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos");
}

Assistant:

substr Parser::_finish_filter_arena(substr dst, size_t pos)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= dst.len);
    memcpy(dst.str, m_filter_arena.str, pos);
    return dst.first(pos);
}